

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_merge_distr_patch
               (Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *alpha;
  bool bVar11;
  double d_one;
  void *src_data_ptr;
  Integer mlo [7];
  Integer mhi [7];
  Integer dhi [7];
  Integer dlo [7];
  Integer mld [7];
  undefined8 local_198;
  undefined8 uStack_190;
  long local_188;
  long local_180;
  long local_178;
  void *local_170;
  Integer local_168 [8];
  Integer local_128 [8];
  Integer local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  iVar6 = _ga_sync_end;
  bVar11 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"nga_merge_distr_patch");
  pnga_check_handle(g_b,"nga_merge_distr_patch");
  local_180 = g_a * 0x368;
  if (((long)GA[g_a + 1000].p_handle < 0) || (PGRP_LIST[GA[g_a + 1000].p_handle].mirrored == 0)) {
    IVar7 = pnga_cluster_nnodes();
    if (IVar7 < 2) {
      local_168[0]._0_2_ = 0x4e;
      pnga_copy_patch((char *)local_168,g_a,alo,ahi,g_b,blo,bhi);
      return;
    }
    pnga_error("Handle to a non-mirrored array passed",0);
  }
  lVar9 = g_a + 1000;
  local_188 = g_b * 0x368;
  if (((-1 < (long)GA[g_b + 1000].p_handle) && (PGRP_LIST[GA[g_b + 1000].p_handle].mirrored != 0))
     && (IVar7 = pnga_cluster_nnodes(), IVar7 != 0)) {
    pnga_error("Distributed array is mirrored",0);
  }
  sVar1 = GA[lVar9].ndim;
  lVar10 = (long)sVar1;
  sVar2 = GA[g_b + 1000].ndim;
  local_178 = (long)GA[lVar9].p_handle;
  if (sVar1 != sVar2) {
    pnga_error("Global arrays must have same dimension",0);
  }
  iVar3 = GA[lVar9].type;
  if (iVar3 != GA[g_b + 1000].type) {
    pnga_error("Global arrays must be of same type",0);
  }
  if (0 < sVar1) {
    local_180 = local_180 + 0xd4e70;
    lVar9 = 0;
    do {
      lVar8 = alo[lVar9];
      if (((lVar8 < 0) ||
          (lVar4 = *(long *)((long)GA->dims + lVar9 * 8 + local_180 + -0x30), lVar4 <= lVar8)) ||
         ((lVar5 = ahi[lVar9], lVar5 < lVar8 || ((lVar5 < 0 || (lVar4 <= lVar5)))))) {
        pnga_error("Invalid patch index on mirrored GA",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  if (0 < sVar2) {
    local_188 = local_188 + 0xd4e70;
    lVar9 = 0;
    do {
      lVar8 = blo[lVar9];
      if ((((lVar8 < 0) ||
           (lVar4 = *(long *)((long)GA->dims + lVar9 * 8 + local_188 + -0x30), lVar4 <= lVar8)) ||
          (lVar5 = bhi[lVar9], lVar5 < lVar8)) || ((lVar5 < 0 || (lVar4 <= lVar5)))) {
        pnga_error("Invalid patch index on distributed GA",0);
      }
      lVar9 = lVar9 + 1;
    } while (sVar2 != lVar9);
  }
  if (0 < sVar2) {
    lVar9 = 0;
    do {
      if (ahi[lVar9] - alo[lVar9] != bhi[lVar9] - blo[lVar9]) {
        pnga_error("Patch dimensions do not match for index ",lVar9);
      }
      lVar9 = lVar9 + 1;
    } while (sVar2 != lVar9);
  }
  pnga_zero_patch(g_b,blo,bhi);
  pnga_distribution(g_a,(long)PGRP_LIST[local_178].map_proc_list[GAme],local_168,local_128);
  if (0 < sVar1) {
    bVar11 = true;
    lVar9 = 0;
    do {
      if (local_128[lVar9] < alo[lVar9]) {
        bVar11 = false;
      }
      if (ahi[lVar9] < local_168[lVar9]) {
        bVar11 = false;
      }
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
    if (!bVar11) goto LAB_001695e5;
  }
  if (0 < sVar1) {
    lVar9 = 0;
    do {
      lVar8 = local_168[lVar9];
      if (local_168[lVar9] < alo[lVar9]) {
        lVar8 = alo[lVar9];
      }
      local_168[lVar9] = lVar8;
      lVar8 = local_128[lVar9];
      if (ahi[lVar9] < local_128[lVar9]) {
        lVar8 = ahi[lVar9];
      }
      local_128[lVar9] = lVar8;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  pnga_access_ptr(g_a,local_168,local_128,&local_170,local_68);
  if (0 < sVar1) {
    lVar9 = 0;
    do {
      lVar8 = blo[lVar9];
      lVar4 = alo[lVar9];
      local_a8[lVar9] = (local_168[lVar9] + lVar8) - lVar4;
      local_e8[lVar9] = (lVar8 - lVar4) + local_128[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  switch(iVar3) {
  case 0x3e9:
  case 0x3ea:
    alpha = &local_198;
    local_198 = 1;
    break;
  case 0x3eb:
    alpha = &local_198;
    local_198 = CONCAT44(local_198._4_4_,0x3f800000);
    break;
  case 0x3ec:
    alpha = &local_198;
    local_198 = 0x3ff0000000000000;
    break;
  default:
    pnga_error("Type not supported",(long)iVar3);
    alpha = (undefined8 *)0x0;
    break;
  case 0x3ee:
    alpha = &local_198;
    local_198 = 0x3f800000;
    break;
  case 0x3ef:
    alpha = &local_198;
    local_198 = 0x3ff0000000000000;
    uStack_190 = 0;
  }
  pnga_acc(g_b,local_a8,local_e8,local_170,local_68,alpha);
LAB_001695e5:
  if (iVar6 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_merge_distr_patch(Integer g_a, Integer *alo, Integer *ahi,
                            Integer g_b, Integer *blo, Integer *bhi)
/*    Integer g_a  handle to mirrored array
      Integer *alo  indices of lower corner of mirrored array patch
      Integer *ahi  indices of upper corner of mirrored array patch
      Integer g_b  handle to distributed array
      Integer *blo  indices of lower corner of distributed array patch
      Integer *bhi  indices of upper corner of distributed array patch
*/
{
  Integer local_sync_begin, local_sync_end;
  Integer a_handle, b_handle, adim, bdim;
  Integer mlo[MAXDIM], mhi[MAXDIM], mld[MAXDIM];
  Integer dlo[MAXDIM], dhi[MAXDIM];
  char trans[2];
  double d_one;
  Integer type, i_one;
  double z_one[2];
  float  c_one[2];
  float f_one;
  long l_one;
  void *src_data_ptr;
  void *one = NULL;
  Integer i, idim, intersect, p_handle;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end = 1; /*remove any previous masking */
  if (local_sync_begin) pnga_sync();
  pnga_check_handle(g_a, "nga_merge_distr_patch");
  pnga_check_handle(g_b, "nga_merge_distr_patch");

  /* check to make sure that both patches lie within global arrays and
     that patches are the same dimensions */
  a_handle = GA_OFFSET + g_a;
  b_handle = GA_OFFSET + g_b;

  if (!pnga_is_mirrored(g_a)) {
    if (pnga_cluster_nnodes() > 1) {
      pnga_error("Handle to a non-mirrored array passed",0);
    } else {
      trans[0] = 'N';
      trans[1] = '\0';
      pnga_copy_patch(trans, g_a, alo, ahi, g_b, blo, bhi);
      return;
    }
  }

  if (pnga_is_mirrored(g_b) && pnga_cluster_nnodes())
    pnga_error("Distributed array is mirrored",0);

  adim = GA[a_handle].ndim;
  bdim = GA[b_handle].ndim;

  p_handle = GA[a_handle].p_handle;

  if (adim != bdim)
    pnga_error("Global arrays must have same dimension",0);

  type = GA[a_handle].type;
  if (type != GA[b_handle].type)
    pnga_error("Global arrays must be of same type",0);

  for (i=0; i<adim; i++) {
    idim = (Integer)GA[a_handle].dims[i];
    if (alo[i] < 0 || alo[i] >= idim || ahi[i] < 0 || ahi[i] >= idim ||
        alo[i] > ahi[i])
      pnga_error("Invalid patch index on mirrored GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = GA[b_handle].dims[i];
    if (blo[i] < 0 || blo[i] >= idim || bhi[i] < 0 || bhi[i] >= idim ||
        blo[i] > bhi[i])
      pnga_error("Invalid patch index on distributed GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = (Integer)GA[b_handle].dims[i];
    if (ahi[i] - alo[i] != bhi[i] - blo[i])
      pnga_error("Patch dimensions do not match for index ",i);
  }
  pnga_zero_patch(g_b, blo, bhi);

  /* Find coordinates of mirrored array patch that I own */
  i = PGRP_LIST[p_handle].map_proc_list[GAme];
  pnga_distribution(g_a, i, mlo, mhi);
  /* Check to see if mirrored array patch intersects my portion of
     mirrored array */
  intersect = 1;
  for (i=0; i<adim; i++) {
    if (mhi[i] < alo[i]) intersect = 0;
    if (mlo[i] > ahi[i]) intersect = 0;
  }
  if (intersect) {
    /* get portion of mirrored array patch that actually resides on this
       processor */
    for (i=0; i<adim; i++) {
      mlo[i] = GA_MAX(alo[i],mlo[i]);
      mhi[i] = GA_MIN(ahi[i],mhi[i]);
    }

    /* get pointer to locally held distribution */
    pnga_access_ptr(g_a, mlo, mhi, &src_data_ptr, mld);

    /* find indices in distributed array corresponding to this patch */
    for (i=0; i<adim; i++) {
      dlo[i] = blo[i] + mlo[i]-alo[i];
      dhi[i] = blo[i] + mhi[i]-alo[i];
    }

    /* perform accumulate */
    if (type == C_DBL) {
      d_one = 1.0;
      one = &d_one;
    } else if (type == C_DCPL) {
      z_one[0] = 1.0;
      z_one[1] = 0.0;
      one = &z_one;
    } else if (type == C_SCPL) {
      c_one[0] = 1.0;
      c_one[1] = 0.0;
      one = &c_one;
    } else if (type == C_FLOAT) {
      f_one = 1.0;
      one = &f_one;
    } else if (type == C_INT) {
      i_one = 1;
      one = &i_one;
    } else if (type == C_LONG) {
      l_one = 1;
      one = &l_one;
    } else {
      pnga_error("Type not supported",type);
    }
    pnga_acc(g_b, dlo, dhi, src_data_ptr, mld, one);
  }
  if (local_sync_end) pnga_sync();
}